

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

int __thiscall
CRegexParser::compile_char_class_expr
          (CRegexParser *this,utf8_ptr *expr,size_t *exprchars,re_machine *result_machine)

{
  re_recog_type typ;
  size_t sVar1;
  utf8_ptr uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t ch2;
  int iVar5;
  utf8_ptr p;
  char *p_00;
  size_t sVar6;
  long lVar7;
  CRegexParser *this_00;
  size_t local_68;
  utf8_ptr local_60;
  int local_58;
  undefined4 local_54;
  CRegexParser *local_50;
  re_machine *local_48;
  utf8_ptr *local_40;
  size_t *local_38;
  
  sVar1 = *exprchars;
  local_48 = result_machine;
  p.p_ = utf8_ptr::s_inc(expr->p_);
  sVar6 = sVar1 - 1;
  local_68 = sVar6;
  local_60.p_ = p.p_;
  local_40 = expr;
  local_38 = exprchars;
  if (sVar6 == 0) {
    sVar6 = 0;
  }
  else {
    wVar3 = utf8_ptr::s_getch(p.p_);
    local_54 = 0;
    if (wVar3 == L'^') {
      local_58 = 1;
      p.p_ = utf8_ptr::s_inc(p.p_);
      sVar6 = sVar1 - 2;
      local_54 = (undefined4)CONCAT71((int7)((ulong)p.p_ >> 8),1);
      local_68 = sVar6;
      local_60.p_ = p.p_;
      goto LAB_0026d538;
    }
  }
  local_54 = 0;
  local_58 = 0;
LAB_0026d538:
  this->range_buf_cnt_ = 0;
  local_50 = this;
  do {
    wVar3 = L'|';
    lVar7 = 0;
    p_00 = p.p_;
    while (((sVar6 != 0 && (wVar3 = utf8_ptr::s_getch(p_00), wVar3 != L'>')) && (wVar3 != L'|'))) {
      p_00 = utf8_ptr::s_inc(local_60.p_);
      sVar6 = local_68 - 1;
      lVar7 = lVar7 + 1;
      local_68 = sVar6;
      local_60.p_ = p_00;
    }
    uVar2.p_ = local_60.p_;
    if (local_68 == 0) {
      return 0;
    }
    if (lVar7 == 3) {
      wVar4 = utf8_ptr::s_getch_at(p.p_,1);
      if (wVar4 == L'-') {
        wVar4 = utf8_ptr::s_getch(p.p_);
        ch2 = utf8_ptr::s_getch_at(p.p_,2);
        this_00 = local_50;
        add_range_char(local_50,wVar4,ch2);
      }
      else {
LAB_0026d603:
        lVar7 = 0x14;
        while( true ) {
          if (lVar7 == 0x344) {
            return 0;
          }
          if (((long)uVar2.p_ - (long)p.p_ ==
               *(size_t *)((long)&PTR_typeinfo_name_0031f640 + lVar7 + 4)) &&
             (iVar5 = memicmp(p.p_,*(void **)((long)&OS_Mutex::typeinfo + lVar7 + 4),
                              (long)uVar2.p_ - (long)p.p_), this_00 = local_50, iVar5 == 0)) break;
          lVar7 = lVar7 + 0x18;
        }
        typ = *(re_recog_type *)((long)&compile_char_class_expr::classes[0].name + lVar7);
        if (typ == RE_LITERAL) {
          wVar4 = *(wchar_t *)((long)&PTR_typeinfo_0031f648 + lVar7 + 4);
          goto LAB_0026d5c1;
        }
        if ((wVar3 == L'>' && (char)local_54 == '\0') && local_50->range_buf_cnt_ == 0) {
          build_special(local_50,local_48,typ,L'\0');
          goto LAB_0026d6b2;
        }
        add_range_class(local_50,typ);
      }
    }
    else {
      if (lVar7 != 1) goto LAB_0026d603;
      wVar4 = utf8_ptr::s_getch(p.p_);
LAB_0026d5c1:
      this_00 = local_50;
      add_range_char(local_50,wVar4);
    }
    if (wVar3 != L'|') {
      build_char_range(this_00,local_48,local_58);
LAB_0026d6b2:
      local_40->p_ = local_60.p_;
      *local_38 = local_68;
      return 1;
    }
    utf8_ptr::inc(&local_60,&local_68);
    sVar6 = local_68;
    p.p_ = local_60.p_;
  } while( true );
}

Assistant:

int CRegexParser::compile_char_class_expr(utf8_ptr *expr, size_t *exprchars,
                                          re_machine *result_machine)
{
    /* start at the character after the '<' */
    utf8_ptr p = *expr;
    size_t chrem = *exprchars;
    p.inc();
    --chrem;

    /* presume it won't be exclusive */
    int is_exclusive = FALSE;

    /* check for an exclusion flag */
    if (chrem != 0 && p.getch() == '^')
    {
        /* note the exclusion */
        is_exclusive = TRUE;
        
        /* skip the exclusion prefix */
        p.inc();
        --chrem;
    }
    
    /* clear out the range builder buffer */
    range_buf_cnt_ = 0;
    
    /* 
     *   keep going until we find the closing delimiter (or run out of
     *   expression string) 
     */
    for (;;)
    {
        utf8_ptr start;
        wchar_t delim;
        size_t curcharlen;
        size_t curbytelen;
        
        /* remember where the current part starts */
        start = p;
        
        /* scan for the '>' or '|' */
        for (curcharlen = 0 ; chrem != 0 ; p.inc(), --chrem, ++curcharlen)
        {
            /* get the next character */
            delim = p.getch();
            
            /* if it's '>' or '|', we're done */
            if (delim == '>' || delim == '|')
                break;
        }
        
        /* 
         *   If we reached the end of the expression without finding a
         *   closing delimiter, the expression is invalid - treat the whole
         *   thing (starting with the '<') as ordinary characters.  
         */
        if (chrem == 0)
            return FALSE;
        
        /* get the length of this part */
        curbytelen = (size_t)(p.getptr() - start.getptr());
        
        /* 
         *   See what we have.  If we have a single character, it's a
         *   literal.  If we have a character, a hyphen, and another
         *   character, it's a literal range.  Otherwise, it must be one of
         *   our named classes.  
         */
        if (curcharlen == 1)
        {
            /* it's a literal - add the character */
            add_range_char(start.getch());
        }
        else if (curcharlen == 3 && start.getch_at(1) == '-')
        {
            /* it's a literal range - add it */
            add_range_char(start.getch(), start.getch_at(2));
        }
        else
        {
            struct char_class_t
            {
                /* expression name for the class */
                const char *name;
                
                /* length of the class name */
                size_t name_len;
                
                /* 
                 *   literal character, if the name represents a character
                 *   rather than a class - this is used only if code ==
                 *   RE_LITERAL 
                 */
                wchar_t ch;
                
                /* RE_xxx code for the class */
                re_recog_type code;
            };
            static const char_class_t classes[] =
            {
                { "alpha",    5, 0, RE_ALPHA },
                { "digit",    5, 0, RE_DIGIT },
                { "upper",    5, 0, RE_UPPER },
                { "lower",    5, 0, RE_LOWER },
                { "alphanum", 8, 0, RE_ALPHANUM },
                { "space",    5, 0, RE_SPACE },
                { "punct",    5, 0, RE_PUNCT },
                { "newline",  7, 0, RE_NEWLINE },
                { "vspace",   6, 0, RE_VSPACE },
                { "langle",   6, '<', RE_LITERAL },
                { "rangle",   6, '>', RE_LITERAL },
                { "vbar",     4, '|', RE_LITERAL },
                { "caret",    5, '^', RE_LITERAL },
                { "squote",   6, '\'', RE_LITERAL },
                { "dquote",   6, '"', RE_LITERAL },
                { "star",     4, '*', RE_LITERAL },
                { "question", 8, '?', RE_LITERAL },
                { "percent",  7, '%', RE_LITERAL },
                { "dot",      3, '.', RE_LITERAL },
                { "period",   6, '.', RE_LITERAL },
                { "plus",     4, '+', RE_LITERAL },
                { "lsquare",  7, '[', RE_LITERAL },
                { "rsquare",  7, ']', RE_LITERAL },
                { "lparen",   6, '(', RE_LITERAL },
                { "rparen",   6, ')', RE_LITERAL},
                { "lbrace",   6, '{', RE_LITERAL },
                { "rbrace",   6, '}', RE_LITERAL },
                { "dollar",   6, '$', RE_LITERAL },
                { "backslash",9, '\\', RE_LITERAL },
                { "return",   6, 0x000D, RE_LITERAL },
                { "linefeed", 8, 0x000A, RE_LITERAL },
                { "tab",      3, 0x0009, RE_LITERAL },
                { "nul",      3, 0x0000, RE_LITERAL },
                { "null",     4, 0x0000, RE_LITERAL }
            };
            const char_class_t *cp;
            size_t i;
            int found;

            /* scan our name list for a match */
            for (cp = classes, i = 0, found = FALSE ;
                 i < sizeof(classes)/sizeof(classes[0]) ;
                 ++i, ++cp)
            {
                /* 
                 *   if the length matches and the name matches (ignoring
                 *   case), this is the one we want 
                 */
                if (curbytelen == cp->name_len
                    && memicmp(start.getptr(), cp->name, curbytelen) == 0)
                {
                    /* 
                     *   this is it - add either a class range or literal
                     *   range, depending on the meaning of the name 
                     */
                    if (cp->code == RE_LITERAL)
                    {
                        /* it's a name for a literal */
                        add_range_char(cp->ch);
                    }
                    else
                    {
                        /* 
                         *   It's a name for a character class.  As a
                         *   special case for efficiency, if this is the one
                         *   and only thing in this class expression, don't
                         *   create a range expression but instead create a
                         *   special for the class.
                         *   
                         *   Note that we can't do this for an exclusive
                         *   class, since we don't have any special matcher
                         *   for those - implement those with a character
                         *   range as usual.  
                         */
                        if (range_buf_cnt_ == 0
                            && delim == '>'
                            && !is_exclusive)
                        {
                            /*
                             *   This is the only thing, so build a special
                             *   to match this class - this is more
                             *   efficient to store and to match than a
                             *   range expression.  
                             */
                            build_special(result_machine, cp->code, 0);
                            
                            /* skip to the '>' */
                            *expr = p;
                            *exprchars = chrem;
                            
                            /* 
                             *   we're done with the expresion - tell the
                             *   caller we were successful 
                             */
                            return TRUE;
                        }
                        else
                        {
                            /* 
                             *   it's not the only thing, so add the class
                             *   to the range list 
                             */
                            add_range_class(cp->code);
                        }
                    }
                    
                    /* note that we found a match */
                    found = TRUE;
                    
                    /* no need to scan further in our table */
                    break;
                }
            }
            
            /* if we didn't find a match, the whole expression is invalid */
            if (!found)
                return FALSE;
        }
        
        /* 
         *   if we found the '>', we're done; if we found a '|', skip it and
         *   keep going 
         */
        if (delim == '|')
        {
            /* skip the delimiter, and back for another round */
            p.inc(&chrem);
        }
        else
        {
            /* we found the '>', so we're done - add the range recognizer */
            build_char_range(result_machine, is_exclusive);
            
            /* skip up to the '>' */
            *expr = p;
            *exprchars = chrem;
            
            /* tell the caller we were successful */
            return TRUE;
        }
    }
}